

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerMSL::unpack_expression_type
          (string *__return_storage_ptr__,CompilerMSL *this,string *expr_str,SPIRType *type,
          uint32_t physical_type_id,bool packed,bool row_major)

{
  uint32_t uVar1;
  bool bVar2;
  int iVar3;
  SPIRType *type_00;
  undefined7 in_register_00000089;
  char (*ts_3) [2];
  long lVar4;
  undefined4 uStack_78;
  uint32_t columns;
  uint local_70;
  uint32_t vecsize;
  string local_68;
  char *load_swiz;
  undefined4 local_40;
  uint32_t physical_vecsize;
  char *base_type;
  
  ts_3 = (char (*) [2])CONCAT71(in_register_00000089,packed);
  local_40 = SUB84(ts_3,0);
  if (physical_type_id == 0 && !packed) {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)expr_str);
    return __return_storage_ptr__;
  }
  type_00 = type;
  if (physical_type_id != 0) {
    type_00 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,physical_type_id);
    bVar2 = Compiler::is_vector((Compiler *)this,type_00);
    if (((bVar2) && (bVar2 = Compiler::is_array((Compiler *)this,type_00), bVar2)) &&
       (type->vecsize < type_00->vecsize)) {
      ::std::__cxx11::string::string
                ((string *)&local_68,unpack_expression_type::swizzle_lut[type->vecsize - 1],
                 (allocator *)&base_type);
      if ((string *)expr_str->_M_string_length < local_68._M_string_length) {
        ::std::__cxx11::string::~string((string *)&local_68);
      }
      else {
        iVar3 = ::std::__cxx11::string::compare
                          ((ulong)expr_str,
                           (long)expr_str->_M_string_length - local_68._M_string_length,
                           (string *)local_68._M_string_length);
        ::std::__cxx11::string::~string((string *)&local_68);
        if (iVar3 == 0) goto LAB_00297b2c;
      }
      if (2 < type->vecsize - 1) {
        __assert_fail("type.vecsize >= 1 && type.vecsize <= 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp"
                      ,0xefa,
                      "virtual string spirv_cross::CompilerMSL::unpack_expression_type(string, const SPIRType &, uint32_t, bool, bool)"
                     );
      }
      CompilerGLSL::enclose_expression(&local_68,&this->super_CompilerGLSL,expr_str);
      ::std::operator+(__return_storage_ptr__,&local_68,
                       unpack_expression_type::swizzle_lut[type->vecsize - 1]);
      goto LAB_00297bff;
    }
LAB_00297b2c:
    bVar2 = Compiler::is_matrix((Compiler *)this,type_00);
    if (((bVar2) && (bVar2 = Compiler::is_vector((Compiler *)this,type), bVar2)) &&
       (type->vecsize < type_00->vecsize)) {
      if (2 < type->vecsize - 1) {
        __assert_fail("type.vecsize >= 1 && type.vecsize <= 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp"
                      ,0xf00,
                      "virtual string spirv_cross::CompilerMSL::unpack_expression_type(string, const SPIRType &, uint32_t, bool, bool)"
                     );
      }
      CompilerGLSL::enclose_expression(&local_68,&this->super_CompilerGLSL,expr_str);
      ::std::operator+(__return_storage_ptr__,&local_68,
                       unpack_expression_type::swizzle_lut[type->vecsize - 1]);
      goto LAB_00297bff;
    }
  }
  bVar2 = Compiler::is_matrix((Compiler *)this,type);
  if (bVar2) {
    vecsize = type->vecsize;
    if (row_major) {
      lVar4 = 0x18;
      columns = vecsize;
      vecsize = type->columns;
    }
    else {
      lVar4 = 0x14;
      columns = type->columns;
    }
    uVar1 = *(uint32_t *)((type_00->array).stack_storage.aligned_char + lVar4 + -0x38);
    base_type = "float";
    if (type->width == 0x10) {
      base_type = "half";
    }
    physical_vecsize = uVar1;
    join<char_const*&,unsigned_int&,char_const(&)[2],unsigned_int&,char_const(&)[2]>
              (__return_storage_ptr__,(spirv_cross *)&base_type,(char **)&columns,(uint *)0x309ed5,
               (char (*) [2])&vecsize,(uint *)0x31efa1,(char (*) [2])CONCAT44(columns,uStack_78));
    load_swiz = "";
    if (uVar1 != vecsize) {
      load_swiz = unpack_expression_type::swizzle_lut[vecsize - 1];
    }
    for (local_70 = 0; local_70 < columns; local_70 = local_70 + 1) {
      if (local_70 != 0) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      if ((char)local_40 == '\0') {
        join<std::__cxx11::string&,char_const(&)[2],unsigned_int&,char_const(&)[2],char_const*&>
                  (&local_68,(spirv_cross *)expr_str,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x31c69e,
                   (char (*) [2])&local_70,(uint *)0x30e88f,(char (*) [2])&load_swiz,
                   (char **)CONCAT44(columns,uStack_78));
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      }
      else {
        join<char_const*&,unsigned_int&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2],unsigned_int&,char_const(&)[2],char_const(&)[2],char_const*&>
                  (&local_68,(spirv_cross *)&base_type,(char **)&physical_vecsize,(uint *)0x31efa1,
                   (char (*) [2])expr_str,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x31c69e,
                   (char (*) [2])&local_70,(uint *)0x30e88f,(char (*) [2])0x30ae46,
                   (char (*) [2])&load_swiz,(char **)CONCAT44(columns,uStack_78));
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      }
      ::std::__cxx11::string::~string((string *)&local_68);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_68,this,type,0);
  join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
            (__return_storage_ptr__,(spirv_cross *)&local_68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x31efa1,
             (char (*) [2])expr_str,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x30ae46,ts_3);
LAB_00297bff:
  ::std::__cxx11::string::~string((string *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::unpack_expression_type(string expr_str, const SPIRType &type, uint32_t physical_type_id,
                                           bool packed, bool row_major)
{
	// Trivial case, nothing to do.
	if (physical_type_id == 0 && !packed)
		return expr_str;

	const SPIRType *physical_type = nullptr;
	if (physical_type_id)
		physical_type = &get<SPIRType>(physical_type_id);

	static const char *swizzle_lut[] = {
		".x",
		".xy",
		".xyz",
	};

	if (physical_type && is_vector(*physical_type) && is_array(*physical_type) &&
	    physical_type->vecsize > type.vecsize && !expression_ends_with(expr_str, swizzle_lut[type.vecsize - 1]))
	{
		// std140 array cases for vectors.
		assert(type.vecsize >= 1 && type.vecsize <= 3);
		return enclose_expression(expr_str) + swizzle_lut[type.vecsize - 1];
	}
	else if (physical_type && is_matrix(*physical_type) && is_vector(type) && physical_type->vecsize > type.vecsize)
	{
		// Extract column from padded matrix.
		assert(type.vecsize >= 1 && type.vecsize <= 3);
		return enclose_expression(expr_str) + swizzle_lut[type.vecsize - 1];
	}
	else if (is_matrix(type))
	{
		// Packed matrices are stored as arrays of packed vectors. Unfortunately,
		// we can't just pass the array straight to the matrix constructor. We have to
		// pass each vector individually, so that they can be unpacked to normal vectors.
		if (!physical_type)
			physical_type = &type;

		uint32_t vecsize = type.vecsize;
		uint32_t columns = type.columns;
		if (row_major)
			swap(vecsize, columns);

		uint32_t physical_vecsize = row_major ? physical_type->columns : physical_type->vecsize;

		const char *base_type = type.width == 16 ? "half" : "float";
		string unpack_expr = join(base_type, columns, "x", vecsize, "(");

		const char *load_swiz = "";

		if (physical_vecsize != vecsize)
			load_swiz = swizzle_lut[vecsize - 1];

		for (uint32_t i = 0; i < columns; i++)
		{
			if (i > 0)
				unpack_expr += ", ";

			if (packed)
				unpack_expr += join(base_type, physical_vecsize, "(", expr_str, "[", i, "]", ")", load_swiz);
			else
				unpack_expr += join(expr_str, "[", i, "]", load_swiz);
		}

		unpack_expr += ")";
		return unpack_expr;
	}
	else
	{
		return join(type_to_glsl(type), "(", expr_str, ")");
	}
}